

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleGeometryNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer ppaVar1;
  aiNode *this_00;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pushNode(this,this_00,pScene);
  this->m_tokenType = 5;
  this->m_currentNode = this_00;
  handleNodes(this,node,pScene);
  ppaVar1 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppaVar1) {
    (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar1 + -1;
  }
  return;
}

Assistant:

void OpenGEXImporter::handleGeometryNode( DDLNode *node, aiScene *pScene ) {
    aiNode *newNode = new aiNode;
    pushNode( newNode, pScene );
    m_tokenType = Grammar::GeometryNodeToken;
    m_currentNode = newNode;
    handleNodes( node, pScene );

    popNode();
}